

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O3

int Abc_CommandAbc9PoPart2(Abc_Frame_t *pAbc,int argc,char **argv)

{
  Abc_Frame_t *pAbc_00;
  int iVar1;
  uint uVar2;
  Gia_Man_t *pNew;
  char *pcVar3;
  char *pcVar4;
  int iVar5;
  uint fVerbose;
  uint local_54;
  uint local_50;
  uint local_4c;
  uint local_48;
  uint local_44;
  Vec_Ptr_t *vPosEquivs;
  Abc_Frame_t *local_38;
  
  vPosEquivs = (Vec_Ptr_t *)0x0;
  local_54 = 0;
  local_38 = pAbc;
  Extra_UtilGetoptReset();
  local_48 = 1000;
  local_4c = 100;
  local_50 = 10;
  local_44 = 0;
  fVerbose = 0;
LAB_0023f618:
  do {
    while (iVar1 = Extra_UtilGetopt(argc,argv,"SDLUmvh"), pAbc_00 = local_38,
          iVar5 = globalUtilOptind, iVar1 == 0x76) {
      fVerbose = fVerbose ^ 1;
    }
    if (iVar1 < 0x53) {
      if (iVar1 == -1) {
        if (local_38->pGia != (Gia_Man_t *)0x0) {
          pNew = Gia_ManFindPoPartition2
                           (local_38->pGia,local_54,local_50,local_4c,local_48,local_44,fVerbose,
                            &vPosEquivs);
          if (pNew != (Gia_Man_t *)0x0) {
            Abc_FrameUpdateGia(pAbc_00,pNew);
          }
          Abc_FrameReplacePoEquivs(pAbc_00,&vPosEquivs);
          return 0;
        }
        pcVar3 = "Abc_CommandAbc9PoPart(): There is no AIG.\n";
        iVar5 = -1;
        goto LAB_0023f87e;
      }
      if (iVar1 == 0x44) {
        if (argc <= globalUtilOptind) {
          pcVar3 = "Command line switch \"-D\" should be followed by an integer.\n";
          goto LAB_0023f79a;
        }
        uVar2 = atoi(argv[globalUtilOptind]);
        local_50 = uVar2;
      }
      else {
        if (iVar1 != 0x4c) goto LAB_0023f7a6;
        if (argc <= globalUtilOptind) {
          pcVar3 = "Command line switch \"-L\" should be followed by an integer.\n";
LAB_0023f79a:
          Abc_Print(-1,pcVar3);
          goto LAB_0023f7a6;
        }
        uVar2 = atoi(argv[globalUtilOptind]);
        local_4c = uVar2;
      }
    }
    else {
      if (iVar1 == 0x6d) {
        local_44 = local_44 ^ 1;
        goto LAB_0023f618;
      }
      if (iVar1 != 0x55) {
        if (iVar1 == 0x53) {
          if (argc <= globalUtilOptind) {
            pcVar3 = "Command line switch \"-S\" should be followed by an integer.\n";
            goto LAB_0023f79a;
          }
          uVar2 = atoi(argv[globalUtilOptind]);
          local_54 = uVar2;
          goto LAB_0023f6fe;
        }
        goto LAB_0023f7a6;
      }
      if (argc <= globalUtilOptind) {
        pcVar3 = "Command line switch \"-U\" should be followed by an integer.\n";
        goto LAB_0023f79a;
      }
      uVar2 = atoi(argv[globalUtilOptind]);
      local_48 = uVar2;
    }
LAB_0023f6fe:
    globalUtilOptind = iVar5 + 1;
    if ((int)uVar2 < 0) {
LAB_0023f7a6:
      Abc_Print(-2,"usage: &popart2 [-SDLU num] [-mvh]\n");
      Abc_Print(-2,"\t         extracting multi-output sequential logic cones\n");
      Abc_Print(-2,"\t-S num : the index of the PO to start the cluster [default = %d]\n",
                (ulong)local_54);
      Abc_Print(-2,"\t-D num : the max increase in flop count after adding one PO [default = %d]\n",
                (ulong)local_50);
      Abc_Print(-2,"\t-L num : the minimum number of POs in a cluster [default = %d]\n",
                (ulong)local_4c);
      Abc_Print(-2,"\t-U num : the maximum number of POs in a cluster [default = %d]\n",
                (ulong)local_48);
      pcVar4 = "yes";
      pcVar3 = "yes";
      if (local_44 == 0) {
        pcVar3 = "no";
      }
      Abc_Print(-2,"\t-m     : toggle selecting the largest cluster [default = %s]\n",pcVar3);
      if (fVerbose == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar4);
      pcVar3 = "\t-h     : print the command usage\n";
      iVar5 = -2;
LAB_0023f87e:
      Abc_Print(iVar5,pcVar3);
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandAbc9PoPart2( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern Gia_Man_t * Gia_ManFindPoPartition2( Gia_Man_t * p, int iStartNum, int nDelta, int nOutsMin, int nOutsMax, int fSetLargest, int fVerbose, Vec_Ptr_t ** pvPosEquivs );
    Gia_Man_t * pTemp = NULL;
    Vec_Ptr_t * vPosEquivs = NULL;
    int c, iStartNum = 0, nDelta = 10, nOutsMin = 100, nOutsMax = 1000, fSetLargest = 0, fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "SDLUmvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'S':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-S\" should be followed by an integer.\n" );
                goto usage;
            }
            iStartNum = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( iStartNum < 0 )
                goto usage;
            break;
        case 'D':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-D\" should be followed by an integer.\n" );
                goto usage;
            }
            nDelta = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nDelta < 0 )
                goto usage;
            break;
        case 'L':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-L\" should be followed by an integer.\n" );
                goto usage;
            }
            nOutsMin = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nOutsMin < 0 )
                goto usage;
            break;
        case 'U':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-U\" should be followed by an integer.\n" );
                goto usage;
            }
            nOutsMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nOutsMax < 0 )
                goto usage;
            break;
        case 'm':
            fSetLargest ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9PoPart(): There is no AIG.\n" );
        return 1;
    }
    pTemp = Gia_ManFindPoPartition2( pAbc->pGia, iStartNum, nDelta, nOutsMin, nOutsMax, fSetLargest, fVerbose, &vPosEquivs );
    if ( pTemp )
        Abc_FrameUpdateGia( pAbc, pTemp );
    Abc_FrameReplacePoEquivs( pAbc, &vPosEquivs );
    return 0;

usage:
    Abc_Print( -2, "usage: &popart2 [-SDLU num] [-mvh]\n" );
    Abc_Print( -2, "\t         extracting multi-output sequential logic cones\n" );
    Abc_Print( -2, "\t-S num : the index of the PO to start the cluster [default = %d]\n", iStartNum );
    Abc_Print( -2, "\t-D num : the max increase in flop count after adding one PO [default = %d]\n", nDelta );
    Abc_Print( -2, "\t-L num : the minimum number of POs in a cluster [default = %d]\n", nOutsMin );
    Abc_Print( -2, "\t-U num : the maximum number of POs in a cluster [default = %d]\n", nOutsMax );
    Abc_Print( -2, "\t-m     : toggle selecting the largest cluster [default = %s]\n", fSetLargest? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}